

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O2

Mat * __thiscall
ncnn::ModelBin::load(Mat *__return_storage_ptr__,ModelBin *this,int w,int h,int c,int type)

{
  Mat local_70;
  
  (*this->_vptr_ModelBin[2])(&local_70,this,(ulong)(uint)(h * w * c),type);
  if ((local_70.data == (void *)0x0) || (local_70.cstep * (long)local_70.c == 0)) {
    __return_storage_ptr__->data = local_70.data;
    __return_storage_ptr__->refcount = local_70.refcount;
    __return_storage_ptr__->elemsize = local_70.elemsize;
    __return_storage_ptr__->elempack = local_70.elempack;
    __return_storage_ptr__->allocator = local_70.allocator;
    __return_storage_ptr__->dims = local_70.dims;
    __return_storage_ptr__->w = local_70.w;
    __return_storage_ptr__->h = local_70.h;
    __return_storage_ptr__->d = local_70.d;
    __return_storage_ptr__->c = local_70.c;
    __return_storage_ptr__->cstep = local_70.cstep;
    if (local_70.refcount != (int *)0x0) {
      LOCK();
      *local_70.refcount = *local_70.refcount + 1;
      UNLOCK();
    }
  }
  else {
    Mat::reshape(__return_storage_ptr__,&local_70,w,h,c,(Allocator *)0x0);
  }
  if (local_70.refcount != (int *)0x0) {
    LOCK();
    *local_70.refcount = *local_70.refcount + -1;
    UNLOCK();
    if (*local_70.refcount == 0) {
      if (local_70.allocator == (Allocator *)0x0) {
        free(local_70.data);
      }
      else {
        (*(local_70.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Mat ModelBin::load(int w, int h, int c, int type) const
{
    Mat m = load(w * h * c, type);
    if (m.empty())
        return m;

    return m.reshape(w, h, c);
}